

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O2

void saa_envgen_step(SAA_ENV_GEN *saaEGen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  if (saaEGen->enable != '\0') {
    bVar2 = saaEGen->pos;
    bVar1 = saa_envelopes[saaEGen->wave][bVar2];
    saaEGen->flags = bVar1 & 0xf0;
    bVar4 = bVar1 & 0xf;
    saaEGen->volR = bVar4;
    saaEGen->volL = bVar4;
    if (saaEGen->invert != '\0') {
      bVar4 = bVar4 ^ 0xf;
      saaEGen->volR = bVar4;
    }
    if ((bVar1 & 0x40) == 0) {
      bVar2 = bVar2 + 1 & 0x1f;
      saaEGen->pos = bVar2;
    }
    if (saaEGen->step != '\0') {
      bVar3 = saa_envelopes[saaEGen->wave][bVar2] | bVar1;
      saaEGen->flags = bVar3 & 0xf0;
      saaEGen->volL = bVar1 & 0xe;
      saaEGen->volR = bVar4 & 0xe;
      if ((bVar3 & 0x40) == 0) {
        saaEGen->pos = bVar2 + 1 & 0x1f;
      }
    }
  }
  return;
}

Assistant:

static void saa_envgen_step(SAA_ENV_GEN* saaEGen)
{
	UINT8 wdata;
	
	if (! saaEGen->enable)
		return;
	
	wdata = saa_envelopes[saaEGen->wave][saaEGen->pos];
	saaEGen->flags = wdata & 0xF0;
	saaEGen->volL = saaEGen->volR = wdata & 0x0F;
	if (saaEGen->invert)
		saaEGen->volR ^= 0x0F;
	
	if (! (saaEGen->flags & ENV_STAY))
	{
		saaEGen->pos ++;
		saaEGen->pos &= 0x1F;
	}
	if (saaEGen->step)
	{
		saaEGen->flags |= (saa_envelopes[saaEGen->wave][saaEGen->pos] & 0xF0);
		saaEGen->volL &= ~0x01;
		saaEGen->volR &= ~0x01;
		if (! (saaEGen->flags & ENV_STAY))
		{
			saaEGen->pos ++;
			saaEGen->pos &= 0x1F;
		}
	}
	
	return;
}